

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_pbeh.c
# Opt level: O0

void relpbe_set_ext_params(xc_func_type *p,double *ext_params)

{
  double *in_RSI;
  xc_func_type *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double cpars [3];
  double xpars [2];
  double xmuepbe;
  double cbetapbe;
  double xkappa;
  double scalldac;
  double scalggac;
  double cx;
  double *ext_params_00;
  xc_func_type *in_stack_ffffffffffffffa0;
  
  dVar1 = get_ext_param(in_RDI,in_RSI,0);
  dVar2 = get_ext_param(in_RDI,in_RSI,1);
  dVar3 = get_ext_param(in_RDI,in_RSI,2);
  get_ext_param(in_RDI,in_RSI,3);
  get_ext_param(in_RDI,in_RSI,4);
  get_ext_param(in_RDI,in_RSI,5);
  ext_params_00 = (double *)0x3ff0000000000000;
  xc_func_set_ext_params(in_stack_ffffffffffffffa0,(double *)0x3ff0000000000000);
  xc_func_set_ext_params(in_stack_ffffffffffffffa0,ext_params_00);
  *in_RDI->mix_coef = 1.0 - dVar1;
  in_RDI->mix_coef[1] = dVar2;
  in_RDI->mix_coef[2] = dVar3 - dVar2;
  in_RDI->cam_alpha = dVar1;
  return;
}

Assistant:

static void
relpbe_set_ext_params(xc_func_type *p, const double *ext_params)
{
  /* Input parameters */
  double cx;
  double scalggac;
  double scalldac;
  double xkappa;
  double cbetapbe;
  double xmuepbe;

  /* Arrays to pass parameters to internal PBE functionals */
  double xpars[2];
  double cpars[3];

  assert(p != NULL);
  cx = get_ext_param(p, ext_params, 0);
  scalggac = get_ext_param(p, ext_params, 1);
  scalldac = get_ext_param(p, ext_params, 2);
  xkappa = get_ext_param(p, ext_params, 3);
  cbetapbe = get_ext_param(p, ext_params, 4);
  xmuepbe = get_ext_param(p, ext_params, 5);

  /* Collect exchange and correlation parameters */
  xpars[0] = xkappa;
  xpars[1] = xmuepbe;
  cpars[0] = cbetapbe;
  cpars[1] = 0.031090690869654895034; /* PBE default value */
  cpars[2] = 1.0; /* PBE default value */

  /* Set x and c parameters */
  xc_func_set_ext_params(p->func_aux[0], xpars);
  xc_func_set_ext_params(p->func_aux[1], cpars);

  /* Set mixing parameters */
  p->mix_coef[0] = 1.0 - cx;
  p->mix_coef[1] = scalggac;
  p->mix_coef[2] = scalldac-scalggac;

  p->cam_alpha = cx;
}